

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindAllExtensionNumbers
          (DescriptorIndex *this,string_view containing_type,
          vector<int,_std::allocator<int>_> *output)

{
  iterator __position;
  int iVar1;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  _Var2;
  bool bVar3;
  bool bVar4;
  size_t __n;
  int *__args;
  pointer pEVar5;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_48;
  
  __n = containing_type._M_len;
  EnsureFlat(this);
  local_48.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
  super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0;
  local_48.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
  super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = __n;
  local_48.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_int>.
  super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = containing_type._M_str;
  _Var2 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,int>,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>>
                    ((this->by_extension_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->by_extension_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_48,
                     (_Iter_comp_val<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                      )(this->by_extension_).
                       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                       .
                       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                       .tree_.rightmost_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_0UL,_false>
                       .value.
                       super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_true>
                       .super_ExtensionCompare.index);
  if (_Var2._M_current ==
      (this->by_extension_flat_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = false;
  }
  else {
    bVar3 = false;
    __args = &(_Var2._M_current)->extension_number;
    do {
      if (*(size_type *)(__args + -6) == 0) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,
                   0);
      }
      if (*(size_type *)(__args + -6) - 1 != __n) {
        return bVar3;
      }
      if ((__n != 0) &&
         (iVar1 = bcmp((((String *)(__args + -8))->_M_dataplus)._M_p + 1,containing_type._M_str,__n)
         , iVar1 != 0)) {
        return bVar3;
      }
      __position._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)output,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      pEVar5 = (pointer)(__args + 2);
      bVar3 = true;
      bVar4 = true;
      __args = __args + 0xc;
    } while (pEVar5 != (this->by_extension_flat_).
                       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return bVar4;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::FindAllExtensionNumbers(
    absl::string_view containing_type, std::vector<int>* output) {
  EnsureFlat();

  bool success = false;
  auto it = std::lower_bound(
      by_extension_flat_.begin(), by_extension_flat_.end(),
      std::make_tuple(containing_type, 0), by_extension_.key_comp());
  for (;
       it != by_extension_flat_.end() && it->extendee(*this) == containing_type;
       ++it) {
    output->push_back(it->extension_number);
    success = true;
  }

  return success;
}